

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * Curl_copy_header_value(char *header)

{
  bool bVar1;
  size_t len;
  char *end;
  char *start;
  char *header_local;
  
  start = header;
  while( true ) {
    bVar1 = false;
    if (*start != '\0') {
      bVar1 = *start != ':';
    }
    if (!bVar1) break;
    start = start + 1;
  }
  if (*start != '\0') {
    start = start + 1;
  }
  end = start;
  while( true ) {
    bVar1 = false;
    if ((((*end != '\0') && (bVar1 = true, *end != ' ')) && (bVar1 = true, *end != '\t')) &&
       (bVar1 = false, '\t' < *end)) {
      bVar1 = *end < '\x0e';
    }
    if (!bVar1) break;
    end = end + 1;
  }
  len = (size_t)strchr(end,0xd);
  if ((char *)len == (char *)0x0) {
    len = (size_t)strchr(end,10);
  }
  if (len == 0) {
    len = (size_t)strchr(end,0);
  }
  if (len == 0) {
    header_local = (char *)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (((end < len) && (bVar1 = true, *(char *)len != ' ')) &&
         ((bVar1 = true, *(char *)len != '\t' && (bVar1 = false, '\t' < *(char *)len)))) {
        bVar1 = *(char *)len < '\x0e';
      }
      if (!bVar1) break;
      len = len - 1;
    }
    header_local = (char *)Curl_memdup0(end,(len - (long)end) + 1);
  }
  return header_local;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  return Curl_memdup0(start, len);
}